

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSetColumnWidth(ImGuiTable *table,ImGuiTableColumn *column_0,float column_0_width)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiTableColumn *pIVar5;
  int column_n;
  int iVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  
  fVar9 = (GImGui->Style).FramePadding.x * 3.0;
  if ((table->Flags & 0x100000) == 0) {
    fVar8 = ((table->WorkRect).Max.x - column_0->MinX) -
            (float)(~(int)column_0->IndexWithinVisibleSet + table->ColumnsVisibleCount) * fVar9;
  }
  else {
    fVar8 = 3.4028235e+38;
  }
  if (column_0_width <= fVar8) {
    fVar8 = column_0_width;
  }
  fVar8 = (float)(-(uint)(column_0_width < fVar9) & (uint)fVar9 |
                 ~-(uint)(column_0_width < fVar9) & (uint)fVar8);
  if ((column_0->WidthGiven != fVar8) || (NAN(column_0->WidthGiven) || NAN(fVar8))) {
    if ((column_0->WidthRequest != fVar8) || (NAN(column_0->WidthRequest) || NAN(fVar8))) {
      if (column_0->NextVisibleColumn == -1) {
        pIVar5 = (ImGuiTableColumn *)0x0;
      }
      else {
        pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                           (&table->Columns,(int)column_0->NextVisibleColumn);
      }
      table->IsSettingsDirty = true;
      if ((column_0->Flags & 4U) == 0) {
        if ((column_0->Flags & 8U) != 0) {
          if ((pIVar5 == (ImGuiTableColumn *)0x0) || ((pIVar5->Flags & 4) == 0)) {
            fVar1 = pIVar5->WidthRequest;
            fVar2 = column_0->WidthRequest;
            fVar8 = fVar1 - (fVar8 - fVar2);
            uVar7 = -(uint)(fVar9 <= fVar8);
            fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
            pIVar5->WidthRequest = fVar9;
            column_0->WidthRequest = (fVar1 + fVar2) - fVar9;
            if (table->LeftMostStretchedColumnDisplayOrder == -1) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                          ,0x2343,"TableUpdateColumnsWeightFromWidth","ImGui ASSERT FAILED: %s",
                          "table->LeftMostStretchedColumnDisplayOrder != -1");
            }
            _local_38 = ZEXT816(0);
            for (iVar6 = 0; iVar6 < table->ColumnsCount; iVar6 = iVar6 + 1) {
              pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar6);
              if ((pIVar5->IsVisible == true) && ((pIVar5->Flags & 8) != 0)) {
                uVar3 = pIVar5->WidthStretchWeight;
                uVar4 = pIVar5->WidthRequest;
                local_38._4_4_ = (float)local_38._4_4_ + (float)uVar4;
                local_38._0_4_ = (float)local_38._0_4_ + (float)uVar3;
                fStack_30 = fStack_30 + 0.0;
                fStack_2c = fStack_2c + 0.0;
              }
            }
            if (((float)local_38._0_4_ <= 0.0) || ((float)local_38._4_4_ <= 0.0)) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                          ,0x2350,"TableUpdateColumnsWeightFromWidth","ImGui ASSERT FAILED: %s",
                          "visible_weight > 0.0f && visible_width > 0.0f");
            }
            for (iVar6 = 0; iVar6 < table->ColumnsCount; iVar6 = iVar6 + 1) {
              pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar6);
              if ((pIVar5->IsVisible == true) && ((pIVar5->Flags & 8) != 0)) {
                pIVar5->WidthStretchWeight =
                     ((pIVar5->WidthRequest + 0.0) / (float)local_38._4_4_) * (float)local_38._0_4_;
              }
            }
          }
          else {
            fVar8 = (column_0->WidthGiven - fVar8) + pIVar5->WidthGiven;
            uVar7 = -(uint)(fVar8 <= fVar9);
            pIVar5->WidthRequest = (float)(uVar7 & (uint)fVar9 | ~uVar7 & (uint)fVar8);
          }
        }
      }
      else {
        if ((((pIVar5 != (ImGuiTableColumn *)0x0) && ((pIVar5->Flags & 4) != 0)) &&
            (table->LeftMostStretchedColumnDisplayOrder != -1)) &&
           (table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)) {
          fVar8 = pIVar5->WidthRequest - (fVar8 - column_0->WidthRequest);
          uVar7 = -(uint)(fVar9 <= fVar8);
          fVar9 = (float)(~uVar7 & (uint)fVar9 | (uint)fVar8 & uVar7);
          fVar8 = (pIVar5->WidthRequest + column_0->WidthRequest) - fVar9;
          pIVar5->WidthRequest = fVar9;
        }
        column_0->WidthRequest = fVar8;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(ImGuiTable* table, ImGuiTableColumn* column_0, float column_0_width)
{
    // Constraints
    float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // [Resize Rule 2]
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
        {
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
            return;
        }

        // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
        float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
        column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
        column_1->WidthRequest = column_1_width;
        column_0->WidthRequest = column_0_width;
        TableUpdateColumnsWeightFromWidth(table);
    }
}